

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByNumber
          (FileDescriptorTables *this,Descriptor *parent,int number)

{
  second_type pFVar1;
  pair<const_google::protobuf::Descriptor_*,_int> pVar2;
  first_type local_30;
  int local_1c;
  Descriptor *pDStack_18;
  int number_local;
  Descriptor *parent_local;
  FileDescriptorTables *this_local;
  
  local_1c = number;
  pDStack_18 = parent;
  parent_local = (Descriptor *)this;
  pVar2 = std::make_pair<google::protobuf::Descriptor_const*&,int&>
                    (&stack0xffffffffffffffe8,&local_1c);
  local_30.first = pVar2.first;
  local_30.second = pVar2.second;
  pFVar1 = FindPtrOrNull<google::protobuf::hash_map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::Descriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                     (&this->fields_by_number_,&local_30);
  return pFVar1;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByNumber(
    const Descriptor* parent, int number) const {
  return FindPtrOrNull(fields_by_number_, std::make_pair(parent, number));
}